

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O0

bool __thiscall
psy::C::SyntaxWriterDOTFormat::preVisit(SyntaxWriterDOTFormat *this,SyntaxNode *node)

{
  int __val;
  bool bVar1;
  mapped_type *pmVar2;
  reference __k;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  string local_58;
  undefined1 local_38 [8];
  string id;
  SyntaxNode *node_local;
  SyntaxWriterDOTFormat *this_local;
  
  __val = this->count_;
  this->count_ = __val + 1;
  id.field_2._8_8_ = node;
  std::__cxx11::to_string(&local_58,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,'n',
                 &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pmVar2 = std::
           unordered_map<const_psy::C::SyntaxNode_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->id_,(key_type *)((long)&id.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar2,(string *)local_38);
  bVar1 = std::
          stack<const_psy::C::SyntaxNode_*,_std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>_>
          ::empty(&this->nodes_);
  if (!bVar1) {
    __k = std::
          stack<const_psy::C::SyntaxNode_*,_std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>_>
          ::top(&this->nodes_);
    pmVar2 = std::
             unordered_map<const_psy::C::SyntaxNode_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->id_,__k);
    std::make_pair<std::__cxx11::string&,std::__cxx11::string_const&>
              (&local_a8,pmVar2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&this->connections_,&local_a8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a8);
  }
  std::
  stack<const_psy::C::SyntaxNode_*,_std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>_>
  ::push(&this->nodes_,(value_type *)((long)&id.field_2 + 8));
  nodeLabel(this,(SyntaxNode *)id.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_38);
  return true;
}

Assistant:

bool SyntaxWriterDOTFormat::preVisit(const SyntaxNode* node)
{
    const std::string id = 'n' + std::to_string(count_++);
    id_[node] = id;

    if (!nodes_.empty())
        connections_.push_back(std::make_pair(id_[nodes_.top()], id));

    nodes_.push(node);

    nodeLabel(node);

    return true;
}